

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

ATNMachine<unsigned_char> * __thiscall
Centaurus::Grammar<unsigned_char>::operator[](Grammar<unsigned_char> *this,Identifier *id)

{
  mapped_type *pmVar1;
  Identifier *id_local;
  Grammar<unsigned_char> *this_local;
  
  pmVar1 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
           ::at(&this->m_networks,id);
  return pmVar1;
}

Assistant:

const ATNMachine<TCHAR>& operator[](const Identifier& id) const
    {
        return m_networks.at(id);
    }